

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

bool __thiscall QProcessPrivate::_q_startupNotification(QProcessPrivate *this)

{
  bool bVar1;
  QProcess *pQVar2;
  EVP_PKEY_CTX *ctx;
  QProcessPrivate *in_RDI;
  long in_FS_OFFSET;
  QProcess *q;
  QString errorMessage;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  ProcessState state;
  QProcessPrivate *this_00;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  QProcessPrivate *in_stack_ffffffffffffffb0;
  _func_int **local_28;
  QObject *pQStack_20;
  QObject *local_18;
  QObject **local_8;
  
  local_8 = *(QObject ***)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(in_RDI);
  local_18 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  pQStack_20 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QProcessPrivate *)&stack0xffffffffffffffd8;
  QString::QString((QString *)0x790589);
  bVar1 = processStarted(in_stack_ffffffffffffffb0,
                         (QString *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  state = (ProcessState)((ulong)in_RDI >> 0x20);
  if (bVar1) {
    QProcess::setProcessState((QProcess *)this_00,state);
    QProcess::started(pQVar2);
  }
  else {
    QProcess::setProcessState((QProcess *)this_00,state);
    ctx = (EVP_PKEY_CTX *)0x0;
    setErrorAndEmit(this_00,(ProcessError)((ulong)in_RDI >> 0x20),
                    (QString *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    waitForDeadChild(in_stack_ffffffffffffffb0);
    cleanup(in_RDI,ctx);
  }
  QString::~QString((QString *)0x790642);
  if (*(QObject ***)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QProcessPrivate::_q_startupNotification()
{
    Q_Q(QProcess);
#if defined QPROCESS_DEBUG
    qDebug("QProcessPrivate::startupNotification()");
#endif

    QString errorMessage;
    if (processStarted(&errorMessage)) {
        q->setProcessState(QProcess::Running);
        emit q->started(QProcess::QPrivateSignal());
        return true;
    }

    q->setProcessState(QProcess::NotRunning);
    setErrorAndEmit(QProcess::FailedToStart, errorMessage);
#ifdef Q_OS_UNIX
    waitForDeadChild();
#endif
    cleanup();
    return false;
}